

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmScriptGenerator.cxx
# Opt level: O2

void __thiscall cmScriptGenerator::~cmScriptGenerator(cmScriptGenerator *this)

{
  ~cmScriptGenerator(this);
  operator_delete(this,0x70);
  return;
}

Assistant:

cmScriptGenerator::~cmScriptGenerator()
{
}